

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall asl::Socket_::available(Socket_ *this)

{
  uint in_EAX;
  int iVar1;
  long n;
  uint local_18 [2];
  
  local_18[0] = 0xffffffff;
  if ((this->_error == 0) && (iVar1 = *(int *)&(this->super_SmartObject_).field_0xc, -1 < iVar1)) {
    local_18[0] = in_EAX;
    iVar1 = ioctl(iVar1,0x541b,local_18);
    local_18[0] = -(uint)(iVar1 != 0) | local_18[0];
  }
  return local_18[0];
}

Assistant:

int Socket_::available()
{
	if (_error != 0 || _handle < 0)
		return -1;
#ifndef _WIN32
	long n;
	if (ioctl(_handle, FIONREAD, &n) == 0)
#else
	unsigned long n;
	if (ioctlsocket(_handle, FIONREAD, &n) == 0)
#endif
		return (int)n;
	else
		return -1;
}

String Socket_::readLine()
{
	char c;
	String s;
	if (available()>0 || waitInput())
	{
		while (1)
		{
			int n = read(&c, 1);
			if (n <= 0 || c == '\n' || _error != 0)
				break;
			if (s.length() > 16000)
			{
				_error = SOCKET_BAD_LINE;
				s = "";
				break;
			}
			s += c;
		}
	}
	return s;
}

int Socket_::read(void* data, int size)
{
		int s = 0, size0 = size;
		do
		{
#ifdef _WIN32
		int n = recv(_handle, (char*)data, size, 0);
#else
		int n = ::read(_handle, (char*)data, size);
#endif
		if (!_blocking)
			return n;
			if (n <= 0)
			{
			_error = SOCKET_BAD_RECV;
			break;
		}
		data = (char*)data + n;
		s += n;
		size -= n;
		} while (s < size0);
	return s;
	}

int Socket_::write(const void* data, int size)
{
	if (size == 0)
		return 0;
	int s = 0, size0 = size;
	do
	{
#ifdef _WIN32
		int n = ::send(_handle, (const char*)data, size, 0);
#else
		int n = ::send(_handle, data, size, MSG_NOSIGNAL);
#endif
		if (!_blocking)
			return n;
		if (n < 0)
{
			_error = SOCKET_BAD_DATA;
			break;
	}
		data = (char*)data + n;
		s += n;
		size -= n;
	} while (s < size0);
	return s;
}

ByteArray Socket_::read(int n)
{
	ByteArray a((n < 0) ? available() : n);
	n = read(&a[0], a.length());
	return a.resize(max(0, n));
}

void Socket_::skip(int n)
{
	ByteArray a(n);
	read(a.data(), a.length());
}

bool Socket_::disconnected()
{
	return _handle < 0 || _error != 0 || (waitInput(0) && available() <= 0);
}

bool Socket_::waitInput(double t)
{
	if (_handle < 0)
		return false;
	int a = available();
	if (a > 0)
		return true;
	if (a < 0)
	{
		_error = SOCKET_BAD_DATA;
		return true;
	}
	fd_set rset;
	timeval to;
	to.tv_sec = (int)floor(t);
	to.tv_usec = (int)((t-floor(t))*1e6);
	FD_ZERO(&rset);
	FD_SET(handle(), &rset);
	if(select(handle()+1, &rset, 0, 0, &to) >= 0)
		return FD_ISSET(handle(), &rset)!=0;
	_error = SOCKET_BAD_WAIT;
	return true;
}

String Socket_::errorMsg() const
{
	return messages[_error];
}


// PacketSocket (UDP)

PacketSocket_::PacketSocket_()
{
	_type = PACKET;
	_blocking = false;
}

PacketSocket_::PacketSocket_(int fd) : Socket_(fd)
{
	_type = PACKET;
	_blocking = false;
}

String PacketSocket_::readLine()
{
	String s(1000, 0);
	if (waitInput())
	{
		int m = read(&s[0], 1000);
		if (m > 0)
			s[m - 1] = '\0';
		int n = s.indexOf('\n');
		if (n >= 0)
			s[n] = '\0';
	}
	return s.fix();
}

int PacketSocket_::readFrom(InetAddress& a, void* data, int n)
{
	if (_handle < 0)
		init();
	a = InetAddress(_family);
	socklen_t len = (socklen_t)a.length();
	int r= recvfrom(_handle, (char*)data, n, 0, (sockaddr*)a.ptr(), &len);
	return r;
}

void PacketSocket_::sendTo(const InetAddress& to, const void* data, int n)
{
	if (_handle < 0)
		init();
	sendto(_handle, (const char*)data, n, 0, (sockaddr*)to.ptr(), to.length());
}

// LocalSocket (UNIX)

LocalSocket_::LocalSocket_()
{
	_type = LOCAL;
	_family = InetAddress::LOCAL;
}

LocalSocket_::LocalSocket_(int fd) : Socket_(fd)
{
	_type = LOCAL;
	_family = InetAddress::LOCAL;
}

LocalSocket_::~LocalSocket_()
{
#ifdef ASL_SOCKET_LOCAL
	String path = localAddress().toString();
	if (path)
	{
		close();
#ifdef _WIN32
		DeleteFileW(path);
#else
		unlink(path);
#endif
	}
#endif
}

bool LocalSocket_::bind(const String& name)
{
#ifdef ASL_SOCKET_LOCAL
#ifdef _WIN32
	DeleteFileW(name);
#else
	unlink(name);
#endif
	init();
	InetAddress here(name);
	if (::bind(_handle, (sockaddr*)here.ptr(), sizeof(sockaddr_un)))
	{
		_error = SOCKET_BAD_BIND;
		return false;
	}
	return true;
#else
	asl_error("Unix sockets not supported");
	_error = SOCKET_BAD_BIND;
	return false;
#endif
}

Socket_* LocalSocket_::accept()
{
	return new LocalSocket_((int)::accept(_handle, (sockaddr*)0, (socklen_t*)0));
}

}